

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFx.c
# Opt level: O2

Vec_Wec_t * Gia_ManFxRetrieve(Gia_Man_t *p,Vec_Str_t **pvCompl,int fReverse)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int Entry;
  Vec_Wrd_t *__ptr;
  Vec_Int_t *p_00;
  Vec_Wec_t *p_01;
  Vec_Int_t *pVVar6;
  Vec_Str_t *pVVar7;
  Gia_Obj_t *pGVar8;
  int *piVar9;
  Gia_Obj_t *pGVar10;
  int iVar11;
  ulong uVar12;
  byte bVar13;
  bool Entry_00;
  
  iVar1 = Gia_ManAssignNumbers(p);
  iVar2 = Gia_ManLutSizeMax(p);
  __ptr = Gia_ManComputeTruths(p,iVar2,iVar1 - p->vCis->nSize,fReverse);
  p_00 = Vec_IntAlloc(0x10000);
  p_01 = (Vec_Wec_t *)malloc(0x10);
  p_01->nCap = 1000;
  p_01->nSize = 0;
  pVVar6 = (Vec_Int_t *)calloc(1000,0x10);
  p_01->pArray = pVVar6;
  pVVar7 = Vec_StrAlloc(iVar1);
  pVVar7->nSize = iVar1;
  iVar11 = 0;
  memset(pVVar7->pArray,0,(long)iVar1);
  bVar13 = (char)iVar2 - 6;
  if (iVar2 < 7) {
    bVar13 = 0;
  }
  *pvCompl = pVVar7;
  iVar1 = 1;
  do {
    if (p->nObjs <= iVar1) {
      if (iVar11 << (bVar13 & 0x1f) != __ptr->nSize) {
        __assert_fail("Counter * nWords == Vec_WrdSize(vTruths)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFx.c"
                      ,0xef,"Vec_Wec_t *Gia_ManFxRetrieve(Gia_Man_t *, Vec_Str_t **, int)");
      }
      free(__ptr->pArray);
      free(__ptr);
      Vec_IntFree(p_00);
      return p_01;
    }
    iVar2 = Gia_ObjIsLut(p,iVar1);
    if (iVar2 != 0) {
      pGVar8 = Gia_ManObj(p,iVar1);
      iVar2 = Gia_ObjLutSize(p,iVar1);
      piVar9 = Gia_ObjLutFanins(p,iVar1);
      uVar3 = iVar11 << (bVar13 & 0x1f);
      if ((iVar11 << (bVar13 & 0x1f) < 0) || (__ptr->nSize <= (int)uVar3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      iVar11 = iVar11 + 1;
      iVar4 = Kit_TruthIsop((uint *)(__ptr->pArray + uVar3),iVar2,p_00,1);
      if (p_00->nSize == 0) {
        Entry_00 = true;
      }
      else {
        if ((p_00->nSize != 1) || (iVar5 = Vec_IntEntry(p_00,0), iVar5 != 0)) {
          Vec_StrWriteEntry(*pvCompl,pGVar8->Value,(char)iVar4);
          iVar4 = 0;
          if (iVar2 < 1) {
            iVar2 = 0;
          }
          for (; iVar4 < p_00->nSize; iVar4 = iVar4 + 1) {
            iVar5 = Vec_IntEntry(p_00,iVar4);
            pVVar6 = Vec_WecPushLevel(p_01);
            Vec_IntPush(pVVar6,pGVar8->Value);
            uVar12 = 0;
            while ((uint)(iVar2 * 2) != uVar12) {
              uVar3 = iVar5 >> ((byte)uVar12 & 0x1f) & 3;
              switch(uVar3) {
              case 2:
                uVar3 = 0;
              case 1:
                pGVar10 = Gia_ManObj(p,*(int *)((long)piVar9 + uVar12 * 2));
                Entry = Abc_Var2Lit(pGVar10->Value,uVar3);
                Vec_IntPush(pVVar6,Entry);
              case 0:
                uVar12 = uVar12 + 2;
                break;
              case 3:
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFx.c"
                              ,0xea,"Vec_Wec_t *Gia_ManFxRetrieve(Gia_Man_t *, Vec_Str_t **, int)");
              }
            }
            Vec_IntSelectSort(pVVar6->pArray + 1,pVVar6->nSize + -1);
          }
          goto LAB_005d6bfc;
        }
        Entry_00 = p_00->nSize == 0;
      }
      Vec_StrWriteEntry(*pvCompl,pGVar8->Value,Entry_00);
      pVVar6 = Vec_WecPushLevel(p_01);
      Vec_IntPush(pVVar6,pGVar8->Value);
    }
LAB_005d6bfc:
    iVar1 = iVar1 + 1;
  } while( true );
}

Assistant:

Vec_Wec_t * Gia_ManFxRetrieve( Gia_Man_t * p, Vec_Str_t ** pvCompl, int fReverse )
{
    Vec_Wec_t * vCubes;
    Vec_Wrd_t * vTruths;
    Vec_Int_t * vCube, * vCover;
    int nItems, nCutSize, nWords;
    int i, c, v, Lit, Cube, Counter = 0;
//    abctime clk = Abc_Clock();
    nItems = Gia_ManAssignNumbers( p );
    // compute truth tables
    nCutSize = Gia_ManLutSizeMax( p );
    nWords = Abc_Truth6WordNum( nCutSize );
    vTruths = Gia_ManComputeTruths( p, nCutSize, nItems - Gia_ManCiNum(p), fReverse );
    vCover = Vec_IntAlloc( 1 << 16 );
    // collect cubes
    vCubes = Vec_WecAlloc( 1000 );
    *pvCompl = Vec_StrStart( nItems );
    Gia_ManForEachLut( p, i )
    {
        Gia_Obj_t * pObj = Gia_ManObj( p, i );
        int nVars = Gia_ObjLutSize( p, i );
        int * pVars = Gia_ObjLutFanins( p, i );
        word * pTruth = Vec_WrdEntryP( vTruths, Counter++ * nWords );
        int Status = Kit_TruthIsop( (unsigned *)pTruth, nVars, vCover, 1 );
        if ( Vec_IntSize(vCover) == 0 || (Vec_IntSize(vCover) == 1 && Vec_IntEntry(vCover,0) == 0) )
        {
            Vec_StrWriteEntry( *pvCompl, pObj->Value, (char)(Vec_IntSize(vCover) == 0) );
            vCube = Vec_WecPushLevel( vCubes );
            Vec_IntPush( vCube, pObj->Value );
            continue;
        }
        Vec_StrWriteEntry( *pvCompl, pObj->Value, (char)Status );
        Vec_IntForEachEntry( vCover, Cube, c )
        {
            vCube = Vec_WecPushLevel( vCubes );
            Vec_IntPush( vCube, pObj->Value );
            for ( v = 0; v < nVars; v++ )
            {
                Lit = 3 & (Cube >> (v << 1));
                if ( Lit == 1 )
                    Vec_IntPush( vCube, Abc_Var2Lit(Gia_ManObj(p, pVars[v])->Value, 1) );
                else if ( Lit == 2 )
                    Vec_IntPush( vCube, Abc_Var2Lit(Gia_ManObj(p, pVars[v])->Value, 0) );
                else if ( Lit != 0 )
                    assert( 0 );
            }
            Vec_IntSelectSort( Vec_IntArray(vCube) + 1, Vec_IntSize(vCube) - 1 );
        }        
    }
    assert( Counter * nWords == Vec_WrdSize(vTruths) );
    Vec_WrdFree( vTruths );
    Vec_IntFree( vCover );
//    Abc_PrintTime( 1, "Setup time", Abc_Clock() - clk );
    return vCubes;
}